

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PipelineResourceSignatureBase.hpp
# Opt level: O0

void __thiscall
Diligent::PipelineResourceSignatureBase<Diligent::EngineVkImplTraits>::CreateShaderResourceBinding
          (PipelineResourceSignatureBase<Diligent::EngineVkImplTraits> *this,
          IShaderResourceBinding **ppShaderResourceBinding,bool InitStaticResources)

{
  Char *pCVar1;
  RenderDeviceVkImpl *this_00;
  MakeNewRCObj<Diligent::ShaderResourceBindingVkImpl,_Diligent::FixedBlockMemoryAllocator> local_b0;
  ShaderResourceBindingVkImpl *local_88;
  ShaderResourceBindingImplType *pResBindingImpl;
  FixedBlockMemoryAllocator *SRBAllocator;
  PipelineResourceSignatureImplType *pThisImpl;
  string msg_1;
  undefined1 local_40 [8];
  string msg;
  bool InitStaticResources_local;
  IShaderResourceBinding **ppShaderResourceBinding_local;
  PipelineResourceSignatureBase<Diligent::EngineVkImplTraits> *this_local;
  
  msg.field_2._M_local_buf[0xf] = InitStaticResources;
  if (ppShaderResourceBinding == (IShaderResourceBinding **)0x0) {
    FormatString<char[41]>
              ((string *)local_40,(char (*) [41])"ppShaderResourceBinding must not be null");
    pCVar1 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar1,"CreateShaderResourceBinding",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/PipelineResourceSignatureBase.hpp"
               ,0x211);
    std::__cxx11::string::~string((string *)local_40);
  }
  else {
    if (*ppShaderResourceBinding != (IShaderResourceBinding *)0x0) {
      FormatString<char[77]>
                ((string *)&pThisImpl,
                 (char (*) [77])
                 "Overwriting existing shader resource binding pointer may cause memory leaks.");
      pCVar1 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar1,"CreateShaderResourceBinding",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/PipelineResourceSignatureBase.hpp"
                 ,0x214);
      std::__cxx11::string::~string((string *)&pThisImpl);
    }
    SRBAllocator = (FixedBlockMemoryAllocator *)this;
    this_00 = DeviceObjectBase<Diligent::IPipelineResourceSignature,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineResourceSignatureDesc>
              ::GetDevice(&this->
                           super_DeviceObjectBase<Diligent::IPipelineResourceSignature,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineResourceSignatureDesc>
                         );
    pResBindingImpl =
         (ShaderResourceBindingImplType *)
         RenderDeviceBase<Diligent::EngineVkImplTraits>::GetSRBAllocator
                   ((RenderDeviceBase<Diligent::EngineVkImplTraits> *)this_00);
    MakeNewRCObj<Diligent::ShaderResourceBindingVkImpl,_Diligent::FixedBlockMemoryAllocator>::
    MakeNewRCObj(&local_b0,(FixedBlockMemoryAllocator *)pResBindingImpl,
                 "ShaderResourceBinding instance",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/PipelineResourceSignatureBase.hpp"
                 ,0x218,(IObject *)0x0);
    local_88 = MakeNewRCObj<Diligent::ShaderResourceBindingVkImpl,Diligent::FixedBlockMemoryAllocator>
               ::operator()((MakeNewRCObj<Diligent::ShaderResourceBindingVkImpl,Diligent::FixedBlockMemoryAllocator>
                             *)&local_b0,(PipelineResourceSignatureVkImpl **)&SRBAllocator);
    if ((msg.field_2._M_local_buf[0xf] & 1U) != 0) {
      InitializeStaticSRBResources
                ((PipelineResourceSignatureBase<Diligent::EngineVkImplTraits> *)SRBAllocator,
                 (IShaderResourceBinding *)local_88);
    }
    ShaderResourceBindingVkImpl::QueryInterface
              (local_88,(INTERFACE_ID *)IID_ShaderResourceBinding,
               (IObject **)ppShaderResourceBinding);
  }
  return;
}

Assistant:

CreateShaderResourceBinding(IShaderResourceBinding** ppShaderResourceBinding,
                                                                bool                     InitStaticResources) override final
    {
        if (ppShaderResourceBinding == nullptr)
        {
            DEV_ERROR("ppShaderResourceBinding must not be null");
            return;
        }
        DEV_CHECK_ERR(*ppShaderResourceBinding == nullptr, "Overwriting existing shader resource binding pointer may cause memory leaks.");

        PipelineResourceSignatureImplType* pThisImpl{static_cast<PipelineResourceSignatureImplType*>(this)};
        FixedBlockMemoryAllocator&         SRBAllocator{pThisImpl->GetDevice()->GetSRBAllocator()};
        ShaderResourceBindingImplType*     pResBindingImpl{NEW_RC_OBJ(SRBAllocator, "ShaderResourceBinding instance", ShaderResourceBindingImplType)(pThisImpl)};
        if (InitStaticResources)
            pThisImpl->InitializeStaticSRBResources(pResBindingImpl);
        pResBindingImpl->QueryInterface(IID_ShaderResourceBinding, reinterpret_cast<IObject**>(ppShaderResourceBinding));
    }